

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xwinman.c
# Opt level: O2

void process_Xevents(DspInterface dsp)

{
  uint uVar1;
  uint uVar2;
  Window WVar3;
  int iVar4;
  Cursor *pCVar5;
  Cursor CVar6;
  Display *pDVar7;
  undefined4 uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  XEvent report;
  
LAB_00139133:
  do {
    iVar4 = XPending(dsp->display_id);
    if (iVar4 == 0) {
      return;
    }
    XNextEvent(dsp->display_id,&report);
    WVar3 = dsp->DisplayWindow;
    if (report.xany.window == WVar3) {
      if (report.type == 0xc) {
        (*dsp->bitblt_to_screen)
                  (dsp,(DLword *)0x0,(dsp->Visible).x + report.xfocus.mode,
                   (dsp->Visible).y + report.xfocus.detail,report.xexpose.width,
                   report.xexpose.height);
      }
      goto LAB_001396b4;
    }
    if (report.xany.window == dsp->LispWindow) {
      if (report.type == 7) {
        enable_Xkeyboard(currentdsp);
      }
      else if (report.type == 0x16) {
        uVar1 = dsp->ScrollBarWidth;
        uVar2 = dsp->InternalBorderWidth;
        iVar4 = uVar1 + uVar2 * 2;
        uVar8 = (dsp->Display).width + iVar4;
        if ((uint)report.xkey.time._0_4_ < (uint)uVar8) {
          uVar8 = report.xexpose.count;
        }
        uVar13 = uVar1 + 2 + uVar2 * 2;
        if ((uint)report.xkey.time._0_4_ <= uVar13) {
          uVar8 = uVar13;
        }
        uVar9 = uVar8 - iVar4;
        (dsp->Visible).width = uVar9;
        uVar8 = (dsp->Display).height + iVar4;
        if ((uint)report.xkey.time._4_4_ < (uint)uVar8) {
          uVar8 = report.xgraphicsexpose.major_code;
        }
        if ((uint)report.xkey.time._4_4_ <= uVar13) {
          uVar8 = uVar13;
        }
        uVar13 = uVar8 - iVar4;
        (dsp->Visible).height = uVar13;
        XMoveResizeWindow(dsp->display_id,WVar3,0,0,uVar9,uVar13);
        if (noscroll == 0) {
          uVar11 = (uVar1 >> 1) + uVar2 & 0x7fffffff;
          iVar4 = uVar13 + uVar11;
          iVar12 = uVar11 + uVar9;
          iVar10 = (uVar1 >> 1) - uVar2;
          XMoveResizeWindow(dsp->display_id,dsp->VerScrollBar,uVar9,-dsp->InternalBorderWidth,
                            dsp->ScrollBarWidth,(dsp->Visible).height);
          XMoveResizeWindow(dsp->display_id,dsp->HorScrollBar,-dsp->InternalBorderWidth,uVar13,
                            (dsp->Visible).width,dsp->ScrollBarWidth);
          uVar1 = (dsp->Visible).width;
          uVar2 = (dsp->Display).width;
          XMoveResizeWindow(dsp->display_id,dsp->HorScrollButton,
                            (long)(int)((dsp->Visible).x * uVar1) / (long)(int)uVar2 & 0xffffffff,
                            -dsp->InternalBorderWidth,(uVar1 * uVar1) / uVar2 + 1,
                            dsp->ScrollBarWidth);
          uVar1 = (dsp->Visible).height;
          uVar2 = (dsp->Display).height;
          XMoveResizeWindow(dsp->display_id,dsp->VerScrollButton,-dsp->InternalBorderWidth,
                            (long)(int)((dsp->Visible).y * uVar1) / (long)(int)uVar2 & 0xffffffff,
                            dsp->ScrollBarWidth,(uVar1 * uVar1) / uVar2 + 1);
          XMoveResizeWindow(dsp->display_id,dsp->NWGrav,uVar9,uVar13,iVar10,iVar10);
          XMoveResizeWindow(dsp->display_id,dsp->NEGrav,iVar12,uVar13,iVar10,iVar10);
          XMoveResizeWindow(dsp->display_id,dsp->SEGrav,iVar12,iVar4,iVar10,iVar10);
          XMoveResizeWindow(dsp->display_id,dsp->SWGrav,uVar9,iVar4,iVar10,iVar10);
          Scroll(dsp,(dsp->Visible).x,(dsp->Visible).y);
        }
        XFlush(dsp->display_id);
      }
      goto LAB_001396b4;
    }
  } while (noscroll != 0);
  if (report.xany.window == dsp->HorScrollBar) {
    if (report.type != 5) {
      if (report.type != 4) goto LAB_001396b4;
      if (report.xkey.keycode == 3) {
        XDefineCursor(dsp->display_id,report.xany.window,ScrollRightCursor);
        ScrollRight(dsp);
        goto LAB_001396b4;
      }
      if (report.xkey.keycode != 2) {
        if (report.xkey.keycode == 1) {
          XDefineCursor(dsp->display_id,report.xany.window,ScrollLeftCursor);
          ScrollLeft(dsp);
        }
        goto LAB_001396b4;
      }
      pDVar7 = dsp->display_id;
      pCVar5 = &HorizThumbCursor;
      goto LAB_00139685;
    }
    if (report.xkey.keycode == 3) {
LAB_00139577:
      pDVar7 = dsp->display_id;
      pCVar5 = &HorizScrollCursor;
      goto LAB_00139685;
    }
    if (report.xkey.keycode != 2) {
      if (report.xkey.keycode != 1) goto LAB_001396b4;
      goto LAB_00139577;
    }
    JumpScrollHor(dsp,report.xkey.x);
    pDVar7 = dsp->display_id;
    pCVar5 = &HorizScrollCursor;
LAB_001396ac:
    CVar6 = *pCVar5;
  }
  else {
    if (report.xany.window != dsp->VerScrollBar) {
      if ((report.type == 4 && report.xany.window == dsp->NEGrav) &&
         (report.xmotion.is_hint == '\x01')) {
        iVar4 = 3;
      }
      else if ((report.xany.window == dsp->SEGrav && report.type == 4) &&
              (report.xmotion.is_hint == '\x01')) {
        iVar4 = 9;
      }
      else if ((report.xany.window == dsp->SWGrav && report.type == 4) &&
              (report.xmotion.is_hint == '\x01')) {
        iVar4 = 7;
      }
      else {
        if ((report.xany.window != dsp->NWGrav || report.type != 4) ||
           (report.xmotion.is_hint != '\x01')) goto LAB_001396b4;
        iVar4 = 1;
      }
      Set_BitGravity(&report.xbutton,dsp,report.xany.window,iVar4);
      goto LAB_001396b4;
    }
    if (report.type == 5) {
      if (report.xkey.keycode != 3) {
        if (report.xkey.keycode == 2) {
          JumpScrollVer(dsp,report.xkey.y);
          pDVar7 = dsp->display_id;
          pCVar5 = &VertScrollCursor;
          goto LAB_001396ac;
        }
        if (report.xkey.keycode != 1) goto LAB_001396b4;
      }
      pDVar7 = dsp->display_id;
      pCVar5 = &VertScrollCursor;
    }
    else {
      if (report.type != 4) goto LAB_001396b4;
      if (report.xkey.keycode == 3) {
        XDefineCursor(dsp->display_id,report.xany.window,ScrollDownCursor);
        ScrollDown(dsp);
        goto LAB_001396b4;
      }
      if (report.xkey.keycode != 2) {
        if (report.xkey.keycode == 1) {
          XDefineCursor(dsp->display_id,report.xany.window,ScrollUpCursor);
          ScrollUp(dsp);
        }
        goto LAB_001396b4;
      }
      pDVar7 = dsp->display_id;
      pCVar5 = &VertThumbCursor;
    }
LAB_00139685:
    CVar6 = *pCVar5;
  }
  XDefineCursor(pDVar7,report.xany.window,CVar6);
LAB_001396b4:
  XFlush(dsp->display_id);
  goto LAB_00139133;
}

Assistant:

void process_Xevents(DspInterface dsp)
{
  XEvent report;

  while (XPending(dsp->display_id)) {
    XNextEvent(dsp->display_id, &report);
    if (report.xany.window == dsp->DisplayWindow) /* Try the most important window first. */
      switch (report.type) {
#ifndef INIT
        case MotionNotify:
          *CLastUserActionCell68k = MiscStats->secondstmp;
          *EmCursorX68K = (*((DLword *)EmMouseX68K)) =
              (short)((report.xmotion.x + dsp->Visible.x) & 0xFFFF) - Current_Hot_X;
          *EmCursorY68K = (*((DLword *)EmMouseY68K)) =
              (short)((report.xmotion.y + dsp->Visible.y) & 0xFFFF) - Current_Hot_Y;
          break;
        case KeyPress:
          kb_trans(SUNLispKeyMap[(report.xkey.keycode) - KEYCODE_OFFSET], FALSE);
          DoRing();
          if ((KBDEventFlg += 1) > 0) Irq_Stk_End = Irq_Stk_Check = 0;
          break;
        case KeyRelease:
          kb_trans(SUNLispKeyMap[(report.xkey.keycode) - KEYCODE_OFFSET], TRUE);
          DoRing();
          if ((KBDEventFlg += 1) > 0) Irq_Stk_End = Irq_Stk_Check = 0;
          break;
        case ButtonPress:
          switch (report.xbutton.button) {
            case Button1: PUTBASEBIT68K(EmRealUtilin68K, MOUSE_LEFT, FALSE); break;
            case Button2: PUTBASEBIT68K(EmRealUtilin68K, MOUSE_MIDDLE, FALSE); break;
            case Button3: PUTBASEBIT68K(EmRealUtilin68K, MOUSE_RIGHT, FALSE); break;
            case Button4: PUTBASEBIT68K(EmRealUtilin68K, KEYSET_LEFT, FALSE); break;
            case Button5: PUTBASEBIT68K(EmRealUtilin68K, KEYSET_LEFTMIDDLE, FALSE); break;
            case Button5 + 1: PUTBASEBIT68K(EmRealUtilin68K, KEYSET_RIGHT, FALSE); break;
            case Button5 + 2: PUTBASEBIT68K(EmRealUtilin68K, KEYSET_RIGHTMIDDLE, FALSE); break;
            default: break;
          }
          DoRing();
          if ((KBDEventFlg += 1) > 0) Irq_Stk_End = Irq_Stk_Check = 0;
          break;
        case ButtonRelease:
          switch (report.xbutton.button) {
            case Button1: PUTBASEBIT68K(EmRealUtilin68K, MOUSE_LEFT, TRUE); break;
            case Button2: PUTBASEBIT68K(EmRealUtilin68K, MOUSE_MIDDLE, TRUE); break;
            case Button3: PUTBASEBIT68K(EmRealUtilin68K, MOUSE_RIGHT, TRUE); break;
            case Button4: PUTBASEBIT68K(EmRealUtilin68K, KEYSET_LEFT, TRUE); break;
            case Button5: PUTBASEBIT68K(EmRealUtilin68K, KEYSET_LEFTMIDDLE, TRUE); break;
            case Button5 + 1: PUTBASEBIT68K(EmRealUtilin68K, KEYSET_RIGHT, TRUE); break;
            case Button5 + 2: PUTBASEBIT68K(EmRealUtilin68K, KEYSET_RIGHTMIDDLE, TRUE); break;
            default: break;
          }
          DoRing();
          if ((KBDEventFlg += 1) > 0) Irq_Stk_End = Irq_Stk_Check = 0;
          break;
        case EnterNotify: Mouse_Included = TRUE; break;
        case LeaveNotify: Mouse_Included = FALSE; break;
#endif
        case Expose:
          (dsp->bitblt_to_screen)(dsp, 0, report.xexpose.x + dsp->Visible.x,
                                  report.xexpose.y + dsp->Visible.y, report.xexpose.width,
                                  report.xexpose.height);
          break;
        default: break;
      }
    else if (report.xany.window == dsp->LispWindow)
      switch (report.xany.type) {
        case ConfigureNotify:
          lisp_Xconfigure(dsp, report.xconfigure.x, report.xconfigure.y, (unsigned)report.xconfigure.width,
                          (unsigned)report.xconfigure.height);
          break;
        case EnterNotify: enable_Xkeyboard(currentdsp); break;
        case LeaveNotify: break;
        case MapNotify:
          /* Turn the blitting to the screen on */
          break;
        case UnmapNotify:
          /* Turn the blitting to the screen off */
          break;
        default: break;
      }
    else if (noscroll) continue;
    else if (report.xany.window == dsp->HorScrollBar)
      switch (report.type) {
        case ButtonPress:
          switch (report.xbutton.button) {
            case Button1:
              DefineCursor(dsp, dsp->HorScrollBar, &ScrollLeftCursor);
              ScrollLeft(dsp);
              break;
            case Button2:
              DefineCursor(dsp, dsp->HorScrollBar, &HorizThumbCursor);
              break;
            case Button3:
              DefineCursor(dsp, dsp->HorScrollBar, &ScrollRightCursor);
              ScrollRight(dsp);
              break;
            default: break;
          } /* end switch */
          break;
        case ButtonRelease:
          switch (report.xbutton.button) {
            case Button1:
              DefineCursor(dsp, report.xany.window, &HorizScrollCursor);
              break;
            case Button2:
              JumpScrollHor(dsp, report.xbutton.x);
              DefineCursor(dsp, report.xany.window, &HorizScrollCursor);
              break;
            case Button3:
              DefineCursor(dsp, report.xany.window, &HorizScrollCursor);
              break;
            default: break;
          } /* end switch */
	  break;
        default: break;
      }
    else if (report.xany.window == dsp->VerScrollBar)
      switch (report.type) {
        case ButtonPress:
          switch (report.xbutton.button) {
            case Button1:
              DefineCursor(dsp, report.xany.window, &ScrollUpCursor);
              ScrollUp(dsp);
              break;
            case Button2:
              DefineCursor(dsp, report.xany.window, &VertThumbCursor);
              break;
            case Button3:
              DefineCursor(dsp, report.xany.window, &ScrollDownCursor);
              ScrollDown(dsp);
              break;
            default: break;
          } /* end switch */
          break;
        case ButtonRelease:
          switch (report.xbutton.button) {
            case Button1:
              DefineCursor(dsp, report.xany.window, &VertScrollCursor);
              break;
            case Button3:
              DefineCursor(dsp, report.xany.window, &VertScrollCursor);
              break;
            case Button2:
              JumpScrollVer(dsp, report.xbutton.y);
              DefineCursor(dsp, report.xany.window, &VertScrollCursor);
              break;
            default: break;
          } /* end switch */
          break;
        default: break;
      }
    else if ((report.xany.window == dsp->NEGrav) && (report.xany.type == ButtonPress) &&
             ((report.xbutton.button & 0xFF) == Button1))
      Set_BitGravity(&report.xbutton, dsp, dsp->NEGrav, NorthEastGravity);
    else if ((report.xany.window == dsp->SEGrav) && (report.xany.type == ButtonPress) &&
             ((report.xbutton.button & 0xFF) == Button1))
      Set_BitGravity(&report.xbutton, dsp, dsp->SEGrav, SouthEastGravity);
    else if ((report.xany.window == dsp->SWGrav) && (report.xany.type == ButtonPress) &&
             ((report.xbutton.button & 0xFF) == Button1))
      Set_BitGravity(&report.xbutton, dsp, dsp->SWGrav, SouthWestGravity);
    else if ((report.xany.window == dsp->NWGrav) && (report.xany.type == ButtonPress) &&
             ((report.xbutton.button & 0xFF) == Button1))
      Set_BitGravity(&report.xbutton, dsp, dsp->NWGrav, NorthWestGravity);
    XFlush(dsp->display_id);
  } /* end while */
}